

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffpdat(fitsfile *fptr,int *status)

{
  size_t sVar1;
  char tmzone [10];
  int timeref;
  char date [30];
  char card [81];
  char acStack_a8 [12];
  int local_9c;
  char local_98 [32];
  char local_78 [16];
  char acStack_68 [8];
  char acStack_60 [4];
  char acStack_5c [8];
  char acStack_54 [60];
  
  if (0 < *status) {
    return *status;
  }
  ffgstm(local_98,&local_9c,status);
  if (local_9c == 0) {
    builtin_strncpy(acStack_a8," UT",4);
  }
  else {
    builtin_strncpy(acStack_a8," Local",7);
  }
  builtin_strncpy(local_78,"DATE    = \'",0xc);
  strcat(local_78,local_98);
  sVar1 = strlen(local_78);
  builtin_strncpy(local_78 + sVar1,"\' / file creatio",0x10);
  builtin_strncpy(acStack_68 + sVar1,"n date (",8);
  builtin_strncpy(acStack_60 + sVar1,"YYYY-MM-",8);
  builtin_strncpy(acStack_5c + sVar1,"-MM-DDTh",8);
  builtin_strncpy(acStack_54 + sVar1,"h:mm:ss",8);
  strcat(local_78,acStack_a8);
  sVar1 = strlen(local_78);
  (local_78 + sVar1)[0] = ')';
  (local_78 + sVar1)[1] = '\0';
  ffucrd(fptr,"DATE",local_78,status);
  return *status;
}

Assistant:

int ffpdat( fitsfile *fptr,      /* I - FITS file pointer  */
            int   *status)       /* IO - error status      */
/*
  Write the DATE keyword into the FITS header.  If the keyword already
  exists then the date will simply be updated in the existing keyword.
*/
{
    int timeref;
    char date[30], tmzone[10], card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffgstm(date, &timeref, status);

    if (timeref)           /* GMT not available on this machine */
        strcpy(tmzone, " Local");    
    else
        strcpy(tmzone, " UT");    

    strcpy(card, "DATE    = '");
    strcat(card, date);
    strcat(card, "' / file creation date (YYYY-MM-DDThh:mm:ss");
    strcat(card, tmzone);
    strcat(card, ")");

    ffucrd(fptr, "DATE", card, status);

    return(*status);
}